

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O2

void __thiscall TcpServer::~TcpServer(TcpServer *this)

{
  std::_Function_base::~_Function_base(&(this->ts_close_cb).super__Function_base);
  std::_Function_base::~_Function_base(&(this->ts_message_cb).super__Function_base);
  std::_Function_base::~_Function_base(&(this->ts_msg_cb).super__Function_base);
  std::_Function_base::~_Function_base(&(this->ts_connected_cb).super__Function_base);
  std::vector<std::shared_ptr<TcpConnection>,_std::allocator<std::shared_ptr<TcpConnection>_>_>::
  ~vector(&this->ts_tcp_connections);
  Timer::~Timer(&this->ts_timer);
  std::unique_ptr<Threadpool,_std::default_delete<Threadpool>_>::~unique_ptr(&this->ts_thread_pool);
  std::_Vector_base<EventLoop_*,_std::allocator<EventLoop_*>_>::~_Vector_base
            (&(this->ts_conn_loops).super__Vector_base<EventLoop_*,_std::allocator<EventLoop_*>_>);
  std::unique_ptr<Acceptor,_std::default_delete<Acceptor>_>::~unique_ptr(&this->ts_acceptor);
  return;
}

Assistant:

TcpServer::~TcpServer() {

}